

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_count(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  DESCRIPTOR_DATA **ppDVar4;
  char buf [4608];
  char acStack_1228 [4616];
  
  ppDVar4 = &descriptor_list;
  iVar3 = 0;
  uVar2 = 0;
LAB_002acd7c:
  do {
    do {
      ppDVar4 = &((DESCRIPTOR_DATA *)ppDVar4)->next->next;
      if ((DESCRIPTOR_DATA *)ppDVar4 == (DESCRIPTOR_DATA *)0x0) {
        if ((int)count_data[0] <= (int)(iVar3 + uVar2)) {
          count_data[0] = (short)(iVar3 + uVar2);
        }
        sprintf(acStack_1228,"There are %d characters on that you can see.\n\r",(ulong)uVar2);
        send_to_char(acStack_1228,ch);
        return;
      }
    } while (((DESCRIPTOR_DATA *)ppDVar4)->connected != 0);
    bVar1 = can_see(ch,((DESCRIPTOR_DATA *)ppDVar4)->character);
    if (bVar1) {
      bVar1 = is_switched(((DESCRIPTOR_DATA *)ppDVar4)->character);
      if (!bVar1) {
        uVar2 = uVar2 + 1;
        goto LAB_002acd7c;
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void do_count(CHAR_DATA *ch, char *argument)
{
	auto not_seen = 0;
	auto count = 0;

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING)
		{
			if (can_see(ch, d->character) && !is_switched(d->character))
				count++;
			else
				not_seen++;
		}
	}

	if ((count + not_seen) >= count_data[0])
		count_data[0] = count + not_seen;

	char buf[MAX_STRING_LENGTH];
	sprintf(buf, "There are %d characters on that you can see.\n\r", count);
	send_to_char(buf, ch);
}